

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

LY_ERR ly_vlog_build_data_path(ly_ctx *ctx,char **path)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  lysc_node *plVar4;
  lysc_node *local_38;
  lyd_node *local_28;
  lyd_node *dnode;
  LY_ERR rc;
  char **path_local;
  ly_ctx *ctx_local;
  
  dnode._4_4_ = LY_SUCCESS;
  local_28 = (lyd_node *)0x0;
  *path = (char *)0x0;
  lVar1 = __tls_get_addr(&PTR_00277fa0);
  if (*(int *)(lVar1 + 0x24) != 0) {
    lVar1 = __tls_get_addr(&PTR_00277fa0);
    lVar1 = *(long *)(lVar1 + 0x28);
    lVar2 = __tls_get_addr(&PTR_00277fa0);
    local_28 = *(lyd_node **)(lVar1 + (ulong)(*(int *)(lVar2 + 0x24) - 1) * 8);
    if (local_28 == (lyd_node *)0x0) {
      lVar1 = __tls_get_addr(&PTR_00277fa0);
      if (*(int *)(lVar1 + 0x24) != 1) {
        __assert_fail("log_location.dnodes.count == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/log.c"
                      ,0x300,"LY_ERR ly_vlog_build_data_path(const struct ly_ctx *, char **)");
      }
      pcVar3 = strdup("/");
      *path = pcVar3;
      if (*path == (char *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_data_path");
        dnode._4_4_ = LY_EMEM;
      }
      goto LAB_001120d6;
    }
    if (local_28->parent == (lyd_node_inner *)0x0) {
      if (local_28->schema == (lysc_node *)0x0) {
        local_38 = (lysc_node *)0x0;
      }
      else {
        local_38 = local_28->schema->parent;
      }
      plVar4 = lysc_data_node(local_38);
      if (plVar4 != (lysc_node *)0x0) {
        lVar1 = __tls_get_addr(&PTR_00277fa0);
        pcVar3 = lyd_path_set((ly_set *)(lVar1 + 0x20),LYD_PATH_STD);
        *path = pcVar3;
        if (*path == (char *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_data_path");
          dnode._4_4_ = LY_EMEM;
          goto LAB_001120d6;
        }
        goto LAB_00112058;
      }
    }
    lVar1 = __tls_get_addr(&PTR_00277fa0);
    lVar1 = *(long *)(lVar1 + 0x28);
    lVar2 = __tls_get_addr(&PTR_00277fa0);
    pcVar3 = lyd_path(*(lyd_node **)(lVar1 + (ulong)(*(int *)(lVar2 + 0x24) - 1) * 8),LYD_PATH_STD,
                      (char *)0x0,0);
    *path = pcVar3;
    if (*path == (char *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_data_path");
      dnode._4_4_ = LY_EMEM;
      goto LAB_001120d6;
    }
  }
LAB_00112058:
  lVar1 = __tls_get_addr(&PTR_00277fa0);
  if (*(int *)(lVar1 + 0x14) != 0) {
    lVar1 = __tls_get_addr(&PTR_00277fa0);
    lVar1 = *(long *)(lVar1 + 0x18);
    lVar2 = __tls_get_addr(&PTR_00277fa0);
    dnode._4_4_ = ly_vlog_build_path_append
                            (path,*(lysc_node **)(lVar1 + (ulong)(*(int *)(lVar2 + 0x14) - 1) * 8),
                             local_28);
  }
LAB_001120d6:
  if (dnode._4_4_ != LY_SUCCESS) {
    free(*path);
    *path = (char *)0x0;
  }
  return dnode._4_4_;
}

Assistant:

LY_ERR
ly_vlog_build_data_path(const struct ly_ctx *ctx, char **path)
{
    LY_ERR rc = LY_SUCCESS;
    const struct lyd_node *dnode = NULL;

    *path = NULL;

    if (log_location.dnodes.count) {
        dnode = log_location.dnodes.objs[log_location.dnodes.count - 1];
        if (!dnode) {
            /* special root node */
            assert(log_location.dnodes.count == 1);
            *path = strdup("/");
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
            goto cleanup;
        }

        if (dnode->parent || !lysc_data_parent(dnode->schema)) {
            /* data node with all of its parents */
            *path = lyd_path(log_location.dnodes.objs[log_location.dnodes.count - 1], LYD_PATH_STD, NULL, 0);
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        } else {
            /* data parsers put all the parent nodes in the set, but they are not connected */
            *path = lyd_path_set(&log_location.dnodes, LYD_PATH_STD);
            LY_CHECK_ERR_GOTO(!*path, LOGMEM(ctx); rc = LY_EMEM, cleanup);
        }
    }

    /* sometimes the last node is not created yet and we only have the schema node */
    if (log_location.scnodes.count) {
        rc = ly_vlog_build_path_append(path, log_location.scnodes.objs[log_location.scnodes.count - 1], dnode);
        LY_CHECK_GOTO(rc, cleanup);
    }

cleanup:
    if (rc) {
        free(*path);
        *path = NULL;
    }
    return rc;
}